

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int count_square(MATRIX *matrix,int n,int i,int j)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = 0;
  lVar3 = (long)((i / 3) * 3);
  do {
    lVar4 = ~(long)(j % 3) + (long)j;
    do {
      iVar2 = iVar2 + (uint)(*(int *)(*(long *)&(matrix->
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 4 + lVar4 * 4) ==
                            n);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (j / 3) * 3 + 2);
    bVar1 = lVar3 < (i / 3) * 3 + 2;
    lVar3 = lVar3 + 1;
  } while (bVar1);
  return iVar2;
}

Assistant:

int count_square(MATRIX &matrix, int n, int i, int j){
    int n_rows=0;
    for(int k=i/3*3; k<(i/3*3)+3; k++){
        for (int l=j/3*3;l<(j/3*3)+3; l++){
            if (matrix[k][l]==n){
                n_rows++;
            }
        }
    }
    return n_rows;
}